

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplified-instance-converter.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *filepath;
  _Bool _Var1;
  FILE *fh_00;
  FILE *fh;
  Instance instance;
  char *output;
  char *input;
  char **argv_local;
  int argc_local;
  
  if (argc != 3) {
    print_usage((FILE *)_stderr,*argv);
    exit(1);
  }
  filepath = argv[1];
  instance.edge_weight = (double *)argv[2];
  parse((Instance *)&fh,filepath);
  _Var1 = is_valid_instance((Instance *)&fh);
  if (!_Var1) {
    fprintf(_stderr,"%s: failed to parse\n",filepath);
    exit(1);
  }
  fh_00 = fopen((char *)instance.edge_weight,"w");
  if (fh_00 == (FILE *)0x0) {
    fprintf(_stderr,"%s: failed to open file for writing\n",instance.edge_weight);
    instance_destroy((Instance *)&fh);
    exit(1);
  }
  render_instance_into_vrplib_file((FILE *)fh_00,(Instance *)&fh,true);
  instance_destroy((Instance *)&fh);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 3) {
        print_usage(stderr, argv[0]);
        exit(EXIT_FAILURE);
    }

    char *input = argv[1];
    char *output = argv[2];

    Instance instance = parse(input);
    if (!is_valid_instance(&instance)) {
        fprintf(stderr, "%s: failed to parse\n", input);
        exit(EXIT_FAILURE);
    }

    FILE *fh = fopen(output, "w");
    if (!fh) {
        fprintf(stderr, "%s: failed to open file for writing\n", output);
        instance_destroy(&instance);
        exit(EXIT_FAILURE);
    }

    render_instance_into_vrplib_file(fh, &instance, true);
    instance_destroy(&instance);
    return EXIT_SUCCESS;
}